

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmaster.c
# Opt level: O0

void prepare_range_limit_table(j_decompress_ptr cinfo)

{
  void *__s;
  long in_RDI;
  int i;
  JSAMPLE *table;
  int local_14;
  
  __s = (void *)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x580);
  *(long *)(in_RDI + 0x1a8) = (long)__s + 0x100;
  memset(__s,0,0x100);
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    *(char *)((long)__s + 0x100 + (long)local_14) = (char)local_14;
  }
  for (local_14 = 0x80; local_14 < 0x200; local_14 = local_14 + 1) {
    *(undefined1 *)((long)__s + (long)local_14 + 0x180) = 0xff;
  }
  memset((void *)((long)__s + 0x380),0,0x180);
  memcpy((void *)((long)__s + 0x500),*(void **)(in_RDI + 0x1a8),0x80);
  return;
}

Assistant:

LOCAL(void)
prepare_range_limit_table(j_decompress_ptr cinfo)
/* Allocate and fill in the sample_range_limit table */
{
  JSAMPLE *table;
  int i;

  table = (JSAMPLE *)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                (5 * (MAXJSAMPLE + 1) + CENTERJSAMPLE) * sizeof(JSAMPLE));
  table += (MAXJSAMPLE + 1);    /* allow negative subscripts of simple table */
  cinfo->sample_range_limit = table;
  /* First segment of "simple" table: limit[x] = 0 for x < 0 */
  MEMZERO(table - (MAXJSAMPLE + 1), (MAXJSAMPLE + 1) * sizeof(JSAMPLE));
  /* Main part of "simple" table: limit[x] = x */
  for (i = 0; i <= MAXJSAMPLE; i++)
    table[i] = (JSAMPLE)i;
  table += CENTERJSAMPLE;       /* Point to where post-IDCT table starts */
  /* End of simple table, rest of first half of post-IDCT table */
  for (i = CENTERJSAMPLE; i < 2 * (MAXJSAMPLE + 1); i++)
    table[i] = MAXJSAMPLE;
  /* Second half of post-IDCT table */
  MEMZERO(table + (2 * (MAXJSAMPLE + 1)),
          (2 * (MAXJSAMPLE + 1) - CENTERJSAMPLE) * sizeof(JSAMPLE));
  MEMCOPY(table + (4 * (MAXJSAMPLE + 1) - CENTERJSAMPLE),
          cinfo->sample_range_limit, CENTERJSAMPLE * sizeof(JSAMPLE));
}